

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall SStringView_REnd_Test::SStringView_REnd_Test(SStringView_REnd_Test *this)

{
  SStringView_REnd_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SStringView_REnd_Test_00354ac8;
  return;
}

Assistant:

TEST (SStringView, REnd) {
    std::string const src{"abc"};
    using sv_type = pstore::sstring_view<char const *>;
    sv_type sv = pstore::make_sstring_view (src.data (), src.length ());
    sv_type const & csv = sv;

    sv_type::reverse_iterator rend = sv.rend ();
    sv_type::const_reverse_iterator const_rend1 = csv.rend ();
    sv_type::const_reverse_iterator const_rend2 = sv.crend ();

    EXPECT_NE (rend, sv.rbegin ());
    EXPECT_NE (const_rend1, csv.rbegin ());
    EXPECT_NE (const_rend2, sv.rbegin ());

    EXPECT_EQ (rend - sv.rbegin (), 3);
    EXPECT_EQ (const_rend1 - csv.rbegin (), 3);
    EXPECT_EQ (const_rend2 - sv.crbegin (), 3);

    EXPECT_EQ (rend, const_rend1);
    EXPECT_EQ (rend, const_rend2);
    EXPECT_EQ (const_rend1, const_rend2);
}